

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

uint32 __thiscall
IRBuilderAsmJs::GetTypedRegFromRegSlot(IRBuilderAsmJs *this,RegSlot reg,Types type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  undefined1 local_3c [8];
  TypedSlotInfo typedInfo;
  
  AsmJsJITInfo::GetTypedSlotInfo((TypedSlotInfo *)local_3c,this->m_asmFuncInfo,type);
  uVar4 = reg - this->m_firstsType[(int)(type + LIMIT)];
  if ((reg < this->m_firstsType[(int)(type + LIMIT)]) ||
     (this->m_firstsType[(int)(type + (SIMD|FLOAT32))] <= reg)) {
    if (reg < this->m_firstsType[10]) {
      if (((reg != 0) && (reg < this->m_firstsType[5])) &&
         (reg = reg - this->m_firstsType[type], (uint)local_3c._0_4_ <= reg)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1c2,"(srcReg < typedInfo.constCount)","srcReg < typedInfo.constCount")
        ;
        if (!bVar2) {
LAB_004b7b2f:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
    else {
      uVar4 = reg - this->m_firstsType[(int)(type + 10)];
      if (typedInfo.constCount <= uVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1bc,"(srcReg < typedInfo.tmpCount)","srcReg < typedInfo.tmpCount");
        if (!bVar2) goto LAB_004b7b2f;
        *puVar3 = 0;
      }
      reg = uVar4 + local_3c._4_4_ + local_3c._0_4_;
    }
  }
  else {
    if ((uint)local_3c._4_4_ <= uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x1b6,"(srcReg < typedInfo.varCount)","srcReg < typedInfo.varCount");
      if (!bVar2) goto LAB_004b7b2f;
      *puVar3 = 0;
    }
    reg = uVar4 + local_3c._0_4_;
  }
  return reg;
}

Assistant:

uint32 IRBuilderAsmJs::GetTypedRegFromRegSlot(Js::RegSlot reg, WAsmJs::Types type)
{
    const auto typedInfo = m_asmFuncInfo->GetTypedSlotInfo(type);
    Js::RegSlot srcReg = reg;
    if (RegIsTypedVar(reg, type))
    {
        srcReg = reg - GetFirstVar(type);
        Assert(srcReg < typedInfo.varCount);
        srcReg += typedInfo.constCount;
    }
    else if (RegIsTemp(reg))
    {
        srcReg = reg - GetFirstTmp(type);
        Assert(srcReg < typedInfo.tmpCount);
        srcReg += typedInfo.varCount + typedInfo.constCount;
    }
    else if (RegIsConstant(reg))
    {
        srcReg = reg - GetFirstConst(type);
        Assert(srcReg < typedInfo.constCount);
    }
    return srcReg;
}